

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall
mkvmuxer::Segment::DoNewClusterProcessing
          (Segment *this,uint64_t track_number,uint64_t frame_timestamp_ns,bool is_key)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  
  while( true ) {
    uVar2 = TestFrame(this,track_number,frame_timestamp_ns,is_key);
    if (((int)uVar2 < 0) ||
       (((this->force_new_cluster_ = false, uVar2 != 0 &&
         (bVar1 = MakeNewCluster(this,frame_timestamp_ns), !bVar1)) ||
        (iVar3 = WriteFramesAll(this), iVar3 < 0)))) break;
    if (uVar2 < 2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Segment::DoNewClusterProcessing(uint64_t track_number,
                                     uint64_t frame_timestamp_ns, bool is_key) {
  for (;;) {
    // Based on the characteristics of the current frame and current
    // cluster, decide whether to create a new cluster.
    const int result = TestFrame(track_number, frame_timestamp_ns, is_key);
    if (result < 0)  // error
      return false;

    // Always set force_new_cluster_ to false after TestFrame.
    force_new_cluster_ = false;

    // A non-zero result means create a new cluster.
    if (result > 0 && !MakeNewCluster(frame_timestamp_ns))
      return false;

    // Write queued (audio) frames.
    const int frame_count = WriteFramesAll();
    if (frame_count < 0)  // error
      return false;

    // Write the current frame to the current cluster (if TestFrame
    // returns 0) or to a newly created cluster (TestFrame returns 1).
    if (result <= 1)
      return true;

    // TestFrame returned 2, which means there was a large time
    // difference between the cluster and the frame itself.  Do the
    // test again, comparing the frame to the new cluster.
  }
}